

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::LE_Fire_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,LE_Fire_PDU *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  ostream *poVar3;
  KStringStream ss;
  KString local_228;
  KString local_208;
  KString local_1e8;
  KString local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  LE_Header::GetAsString_abi_cxx11_(&local_228,&this->super_LE_Header);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-LE Fire PDU-\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Optional Field Flags:\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\tTarget ID:                            ",0x27);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\tMunition ID:                          ",0x27);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\tMunition Site & Application Included: ",0x27);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\tEvent Site & Application Included:    ",0x27);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\tWarhead & Fuse Included:              ",0x27);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\tQuantity & Rate Included:             ",0x27);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\tLocation:                             ",0x27);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  paVar1 = &local_228.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  bVar2 = (this->m_FireFlagUnion).m_ui8Flag;
  if ((bVar2 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"Target ID: ",0xb);
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&local_228,&this->m_TargetID);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_228._M_dataplus._M_p,local_228._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    bVar2 = (this->m_FireFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"Munition ID: ",0xd);
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&local_228,&this->m_MunitionID);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_228._M_dataplus._M_p,local_228._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Event ID: ",10);
  DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_(&local_228,&this->m_EventID);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_228._M_dataplus._M_p,local_228._M_string_length);
  DATA_TYPE::MunitionDescriptor::GetAsString_abi_cxx11_(&local_1c8,&this->m_MunitionDesc);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  DATA_TYPE::RelativeWorldCoordinates::GetAsString_abi_cxx11_(&local_1e8,&this->m_Loc);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Velocity: ",10);
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>>::GetAsString_abi_cxx11_
            (&local_208,&this->m_Vel);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Range: ",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

KString LE_Fire_PDU::GetAsString() const
{
    KStringStream ss;

    ss << LE_Header::GetAsString()
       << "-LE Fire PDU-\n"
       << "Optional Field Flags:\n"
       << "\tTarget ID:                            " << ( KUINT16 )m_FireFlagUnion.m_ui8TargetId         << "\n"
       << "\tMunition ID:                          " << ( KUINT16 )m_FireFlagUnion.m_ui8MunitionId       << "\n"
       << "\tMunition Site & Application Included: " << ( KUINT16 )m_FireFlagUnion.m_ui8MunitionSiteApp  << "\n"
       << "\tEvent Site & Application Included:    " << ( KUINT16 )m_FireFlagUnion.m_ui8EventSiteAppId   << "\n"
       << "\tWarhead & Fuse Included:              " << ( KUINT16 )m_FireFlagUnion.m_ui8WarheadFuse      << "\n"
       << "\tQuantity & Rate Included:             " << ( KUINT16 )m_FireFlagUnion.m_ui8QuantRate        << "\n"
       << "\tLocation:                             " << ( KUINT16 )m_FireFlagUnion.m_ui8Location         << "\n";

    if( m_FireFlagUnion.m_ui8TargetId )
    {
        ss << "Target ID: " << m_TargetID.GetAsString();
    }

    if( m_FireFlagUnion.m_ui8MunitionId )
    {
        ss << "Munition ID: " << m_MunitionID.GetAsString();
    }

    ss << "Event ID: " << m_EventID.GetAsString()
       << m_MunitionDesc.GetAsString()
       << m_Loc.GetAsString()
       << "Velocity: " << m_Vel.GetAsString()
       << "Range: " << m_ui16Range
       << "\n";

    return ss.str();
}